

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::calcForces(ForceManager *this)

{
  bool bVar1;
  long *in_RDI;
  ForceManager *in_stack_00000290;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    initialize(in_stack_00000290);
  }
  (**(code **)(*in_RDI + 0x28))();
  (**(code **)(*in_RDI + 0x30))();
  SimInfo::getSimParams((SimInfo *)in_RDI[3]);
  bVar1 = Globals::getSkipPairLoop((Globals *)0x143fff);
  if (!bVar1) {
    (**(code **)(*in_RDI + 0x38))();
  }
  (**(code **)(*in_RDI + 0x40))();
  return;
}

Assistant:

void ForceManager::calcForces() {
    if (!initialized_) initialize();

    preCalculation();
    shortRangeInteractions();
    if (info_->getSimParams()->getSkipPairLoop() == false)
      longRangeInteractions();
    postCalculation();
  }